

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O0

int uECC_verify(uint8_t *public_key,uint8_t *message_hash,uint hash_size,uint8_t *signature,
               uECC_Curve curve)

{
  char num_words_00;
  uECC_word_t *puVar1;
  char num_words_01;
  cmpresult_t cVar2;
  bitcount_t bVar3;
  bitcount_t b;
  uECC_word_t uVar4;
  uECC_word_t uVar5;
  uECC_word_t index;
  wordcount_t num_n_words;
  wordcount_t num_words;
  uECC_word_t s [4];
  uECC_word_t r [4];
  uECC_word_t _public [8];
  bitcount_t i;
  bitcount_t num_bits;
  uECC_word_t *point;
  uECC_word_t *points [4];
  uECC_word_t tz [4];
  uECC_word_t ty [4];
  uECC_word_t tx [4];
  uECC_word_t ry [4];
  uECC_word_t rx [4];
  uECC_word_t sum [8];
  uECC_word_t z [4];
  uECC_word_t u2 [4];
  uECC_word_t u1 [4];
  uECC_Curve curve_local;
  uint8_t *signature_local;
  uint hash_size_local;
  uint8_t *message_hash_local;
  uint8_t *public_key_local;
  
  num_words_00 = curve->num_words;
  num_words_01 = (char)((curve->num_n_bits + 0x3f) / 0x40);
  ry[(long)(num_words_01 + -1) + 3] = 0;
  s[(long)(num_words_01 + -1) + 3] = 0;
  *(undefined8 *)(&stack0xfffffffffffffdd8 + (long)(num_words_01 + -1) * 8) = 0;
  uECC_vli_bytesToNative(r + 3,public_key,(int)curve->num_bytes);
  uECC_vli_bytesToNative
            (r + (long)(int)num_words_00 + 3,public_key + (int)curve->num_bytes,
             (int)curve->num_bytes);
  uECC_vli_bytesToNative(s + 3,signature,(int)curve->num_bytes);
  uECC_vli_bytesToNative
            ((uECC_word_t *)&stack0xfffffffffffffdd8,signature + (int)curve->num_bytes,
             (int)curve->num_bytes);
  uVar4 = uECC_vli_isZero(s + 3,num_words_00);
  if ((uVar4 != 0) ||
     (uVar4 = uECC_vli_isZero((uECC_word_t *)&stack0xfffffffffffffdd8,num_words_00), uVar4 != 0)) {
    return 0;
  }
  cVar2 = uECC_vli_cmp_unsafe(curve->n,s + 3,num_words_01);
  if ((cVar2 == '\x01') &&
     (cVar2 = uECC_vli_cmp_unsafe(curve->n,(uECC_word_t *)&stack0xfffffffffffffdd8,num_words_01),
     cVar2 == '\x01')) {
    uECC_vli_modInv(sum + 7,(uECC_word_t *)&stack0xfffffffffffffdd8,curve->n,num_words_01);
    u2[(long)(num_words_01 + -1) + 3] = 0;
    bits2int(u2 + 3,message_hash,hash_size,curve);
    uECC_vli_modMult(u2 + 3,u2 + 3,sum + 7,curve->n,num_words_01);
    uECC_vli_modMult(z + 3,s + 3,sum + 7,curve->n,num_words_01);
    uECC_vli_set(rx + 3,r + 3,num_words_00);
    uECC_vli_set(rx + (long)(int)num_words_00 + 3,r + (long)(int)num_words_00 + 3,num_words_00);
    uECC_vli_set(ty + 3,curve->G,num_words_00);
    uECC_vli_set(tz + 3,curve->G + (int)num_words_00,num_words_00);
    uECC_vli_modSub(sum + 7,rx + 3,ty + 3,curve->p,num_words_00);
    XYcZ_add(ty + 3,tz + 3,rx + 3,rx + (long)(int)num_words_00 + 3,curve);
    uECC_vli_modInv(sum + 7,sum + 7,curve->p,num_words_00);
    apply_z(rx + 3,rx + (long)(int)num_words_00 + 3,sum + 7,curve);
    points[0] = curve->G;
    points[1] = r + 3;
    points[2] = rx + 3;
    bVar3 = uECC_vli_numBits(u2 + 3,num_words_01);
    b = uECC_vli_numBits(z + 3,num_words_01);
    bVar3 = smax(bVar3,b);
    uVar4 = uECC_vli_testBit(u2 + 3,bVar3 + -1);
    uVar5 = uECC_vli_testBit(z + 3,bVar3 + -1);
    puVar1 = points[(long)(int)((uint)(uVar4 != 0) | (uint)(uVar5 != 0) << 1) + -1];
    uECC_vli_set(ry + 3,puVar1,num_words_00);
    uECC_vli_set(tx + 3,puVar1 + (int)num_words_00,num_words_00);
    uECC_vli_clear(sum + 7,num_words_00);
    sum[7] = 1;
    for (_public[7]._4_2_ = bVar3 + -2; -1 < _public[7]._4_2_;
        _public[7]._4_2_ = _public[7]._4_2_ + -1) {
      (*curve->double_jacobian)(ry + 3,tx + 3,sum + 7,curve);
      uVar4 = uECC_vli_testBit(u2 + 3,_public[7]._4_2_);
      uVar5 = uECC_vli_testBit(z + 3,_public[7]._4_2_);
      puVar1 = points[(long)(int)((uint)(uVar4 != 0) | (uint)(uVar5 != 0) << 1) + -1];
      if (puVar1 != (uECC_word_t *)0x0) {
        uECC_vli_set(ty + 3,puVar1,num_words_00);
        uECC_vli_set(tz + 3,puVar1 + (int)num_words_00,num_words_00);
        apply_z(ty + 3,tz + 3,sum + 7,curve);
        uECC_vli_modSub((uECC_word_t *)(points + 3),ry + 3,ty + 3,curve->p,num_words_00);
        XYcZ_add(ty + 3,tz + 3,ry + 3,tx + 3,curve);
        uECC_vli_modMult_fast(sum + 7,sum + 7,(uECC_word_t *)(points + 3),curve);
      }
    }
    uECC_vli_modInv(sum + 7,sum + 7,curve->p,num_words_00);
    apply_z(ry + 3,tx + 3,sum + 7,curve);
    cVar2 = uECC_vli_cmp_unsafe(curve->n,ry + 3,num_words_01);
    if (cVar2 != '\x01') {
      uECC_vli_sub(ry + 3,ry + 3,curve->n,num_words_01);
    }
    uVar4 = uECC_vli_equal(ry + 3,s + 3,num_words_00);
    return (int)uVar4;
  }
  return 0;
}

Assistant:

int uECC_verify(const uint8_t *public_key,
                const uint8_t *message_hash,
                unsigned hash_size,
                const uint8_t *signature,
                uECC_Curve curve) {
    uECC_word_t u1[uECC_MAX_WORDS], u2[uECC_MAX_WORDS];
    uECC_word_t z[uECC_MAX_WORDS];
    uECC_word_t sum[uECC_MAX_WORDS * 2];
    uECC_word_t rx[uECC_MAX_WORDS];
    uECC_word_t ry[uECC_MAX_WORDS];
    uECC_word_t tx[uECC_MAX_WORDS];
    uECC_word_t ty[uECC_MAX_WORDS];
    uECC_word_t tz[uECC_MAX_WORDS];
    const uECC_word_t *points[4];
    const uECC_word_t *point;
    bitcount_t num_bits;
    bitcount_t i;
#if uECC_VLI_NATIVE_LITTLE_ENDIAN
    uECC_word_t *_public = (uECC_word_t *)public_key;
#else
    uECC_word_t _public[uECC_MAX_WORDS * 2];
#endif
    uECC_word_t r[uECC_MAX_WORDS], s[uECC_MAX_WORDS];
    wordcount_t num_words = curve->num_words;
    wordcount_t num_n_words = BITS_TO_WORDS(curve->num_n_bits);

    rx[num_n_words - 1] = 0;
    r[num_n_words - 1] = 0;
    s[num_n_words - 1] = 0;

#if uECC_VLI_NATIVE_LITTLE_ENDIAN
    bcopy((uint8_t *) r, signature, curve->num_bytes);
    bcopy((uint8_t *) s, signature + curve->num_bytes, curve->num_bytes);
#else
    uECC_vli_bytesToNative(_public, public_key, curve->num_bytes);
    uECC_vli_bytesToNative(
        _public + num_words, public_key + curve->num_bytes, curve->num_bytes);
    uECC_vli_bytesToNative(r, signature, curve->num_bytes);
    uECC_vli_bytesToNative(s, signature + curve->num_bytes, curve->num_bytes);
#endif

    /* r, s must not be 0. */
    if (uECC_vli_isZero(r, num_words) || uECC_vli_isZero(s, num_words)) {
        return 0;
    }

    /* r, s must be < n. */
    if (uECC_vli_cmp_unsafe(curve->n, r, num_n_words) != 1 ||
            uECC_vli_cmp_unsafe(curve->n, s, num_n_words) != 1) {
        return 0;
    }

    /* Calculate u1 and u2. */
    uECC_vli_modInv(z, s, curve->n, num_n_words); /* z = 1/s */
    u1[num_n_words - 1] = 0;
    bits2int(u1, message_hash, hash_size, curve);
    uECC_vli_modMult(u1, u1, z, curve->n, num_n_words); /* u1 = e/s */
    uECC_vli_modMult(u2, r, z, curve->n, num_n_words); /* u2 = r/s */

    /* Calculate sum = G + Q. */
    uECC_vli_set(sum, _public, num_words);
    uECC_vli_set(sum + num_words, _public + num_words, num_words);
    uECC_vli_set(tx, curve->G, num_words);
    uECC_vli_set(ty, curve->G + num_words, num_words);
    uECC_vli_modSub(z, sum, tx, curve->p, num_words); /* z = x2 - x1 */
    XYcZ_add(tx, ty, sum, sum + num_words, curve);
    uECC_vli_modInv(z, z, curve->p, num_words); /* z = 1/z */
    apply_z(sum, sum + num_words, z, curve);

    /* Use Shamir's trick to calculate u1*G + u2*Q */
    points[0] = 0;
    points[1] = curve->G;
    points[2] = _public;
    points[3] = sum;
    num_bits = smax(uECC_vli_numBits(u1, num_n_words),
                    uECC_vli_numBits(u2, num_n_words));

    point = points[(!!uECC_vli_testBit(u1, num_bits - 1)) |
                   ((!!uECC_vli_testBit(u2, num_bits - 1)) << 1)];
    uECC_vli_set(rx, point, num_words);
    uECC_vli_set(ry, point + num_words, num_words);
    uECC_vli_clear(z, num_words);
    z[0] = 1;

    for (i = num_bits - 2; i >= 0; --i) {
        uECC_word_t index;
        curve->double_jacobian(rx, ry, z, curve);

        index = (!!uECC_vli_testBit(u1, i)) | ((!!uECC_vli_testBit(u2, i)) << 1);
        point = points[index];
        if (point) {
            uECC_vli_set(tx, point, num_words);
            uECC_vli_set(ty, point + num_words, num_words);
            apply_z(tx, ty, z, curve);
            uECC_vli_modSub(tz, rx, tx, curve->p, num_words); /* Z = x2 - x1 */
            XYcZ_add(tx, ty, rx, ry, curve);
            uECC_vli_modMult_fast(z, z, tz, curve);
        }
    }

    uECC_vli_modInv(z, z, curve->p, num_words); /* Z = 1/Z */
    apply_z(rx, ry, z, curve);

    /* v = x1 (mod n) */
    if (uECC_vli_cmp_unsafe(curve->n, rx, num_n_words) != 1) {
        uECC_vli_sub(rx, rx, curve->n, num_n_words);
    }

    /* Accept only if v == r. */
    return (int)(uECC_vli_equal(rx, r, num_words));
}